

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetCompileFeaturesCommand.cxx
# Opt level: O0

bool cmTargetCompileFeaturesCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  cmExecutionStatus *args_00;
  bool bVar1;
  allocator<char> local_79;
  string local_78;
  cmTargetPropCommandBase local_58;
  cmExecutionStatus *local_18;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_18 = status;
  status_local = (cmExecutionStatus *)args;
  anon_unknown.dwarf_940df5::TargetCompileFeaturesImpl::cmTargetPropCommandBase
            ((TargetCompileFeaturesImpl *)&local_58,status);
  args_00 = status_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"COMPILE_FEATURES",&local_79);
  bVar1 = cmTargetPropCommandBase::HandleArguments
                    (&local_58,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)args_00,&local_78,0);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  anon_unknown.dwarf_940df5::TargetCompileFeaturesImpl::~TargetCompileFeaturesImpl
            ((TargetCompileFeaturesImpl *)&local_58);
  return bVar1;
}

Assistant:

bool cmTargetCompileFeaturesCommand(std::vector<std::string> const& args,
                                    cmExecutionStatus& status)
{
  return TargetCompileFeaturesImpl(status).HandleArguments(args,
                                                           "COMPILE_FEATURES");
}